

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2predicates.cc
# Opt level: O0

int s2pred::ExactEdgeCircumcenterSign
              (Vector3_xf *x0,Vector3_xf *x1,Vector3_xf *a,Vector3_xf *b,Vector3_xf *c,int abc_sign)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  ostream *poVar4;
  int *piVar5;
  ExactFloat local_2c8;
  ExactFloat local_2b8;
  ExactFloat local_2a8;
  ExactFloat local_298;
  ExactFloat local_288;
  int local_274 [3];
  ExactFloat local_268;
  undefined1 local_258 [8];
  ExactFloat rhs4;
  int lhs4_sgn;
  int local_23c;
  int local_238;
  int local_234;
  int result;
  int rhs2_sgn;
  int local_220 [4];
  int local_210;
  int lhs2_sgn;
  int rhs3_sgn;
  int lhs3_sgn;
  ExactFloat local_1f8;
  undefined1 local_1e8 [8];
  ExactFloat cab2;
  ExactFloat local_1c8;
  undefined1 local_1b8 [8];
  ExactFloat bca2;
  ExactFloat local_198;
  undefined1 local_188 [8];
  ExactFloat abc2;
  undefined1 local_148 [8];
  ExactFloat dca;
  undefined1 local_108 [8];
  ExactFloat dbc;
  undefined1 local_c8 [8];
  ExactFloat dab;
  Vector3_xf nx;
  S2LogMessage local_80;
  S2LogMessageVoidify local_6d [13];
  ExactFloat local_60;
  ExactFloat local_50;
  int local_3c;
  Vector3_xf *pVStack_38;
  int abc_sign_local;
  Vector3_xf *c_local;
  Vector3_xf *b_local;
  Vector3_xf *a_local;
  Vector3_xf *x1_local;
  Vector3_xf *x0_local;
  
  local_3c = abc_sign;
  pVStack_38 = c;
  c_local = b;
  b_local = a;
  a_local = x1;
  x1_local = x0;
  bVar1 = ArePointsLinearlyDependent(x0,x1);
  if (bVar1) {
    util::math::internal_vector::BasicVector<Vector3,_ExactFloat,_3UL>::DotProd
              ((BasicVector<Vector3,_ExactFloat,_3UL> *)&local_50,x1_local);
    ExactFloat::ExactFloat(&local_60,0);
    bVar1 = operator>(&local_50,&local_60);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      S2FatalLogMessage::S2FatalLogMessage
                ((S2FatalLogMessage *)&local_80,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2predicates.cc"
                 ,0x36a,kFatal,(ostream *)&std::cerr);
      poVar4 = S2LogMessage::stream(&local_80);
      poVar4 = std::operator<<(poVar4,"Check failed: (x0.DotProd(x1)) > (0) ");
      S2LogMessageVoidify::operator&(local_6d,poVar4);
      S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_80);
    }
    ExactFloat::~ExactFloat(&local_60);
    ExactFloat::~ExactFloat(&local_50);
    x0_local._4_4_ = 0;
  }
  else {
    Vector3<ExactFloat>::CrossProd((Vector3<ExactFloat> *)&dab.bn_,x1_local,a_local);
    Vector3<ExactFloat>::CrossProd((Vector3<ExactFloat> *)&dbc.bn_,b_local,c_local);
    util::math::internal_vector::BasicVector<Vector3,_ExactFloat,_3UL>::DotProd
              ((BasicVector<Vector3,_ExactFloat,_3UL> *)local_c8,(D *)&dab.bn_);
    Vector3<ExactFloat>::~Vector3((Vector3<ExactFloat> *)&dbc.bn_);
    Vector3<ExactFloat>::CrossProd((Vector3<ExactFloat> *)&dca.bn_,c_local,pVStack_38);
    util::math::internal_vector::BasicVector<Vector3,_ExactFloat,_3UL>::DotProd
              ((BasicVector<Vector3,_ExactFloat,_3UL> *)local_108,(D *)&dab.bn_);
    Vector3<ExactFloat>::~Vector3((Vector3<ExactFloat> *)&dca.bn_);
    Vector3<ExactFloat>::CrossProd((Vector3<ExactFloat> *)&abc2.bn_,pVStack_38,b_local);
    util::math::internal_vector::BasicVector<Vector3,_ExactFloat,_3UL>::DotProd
              ((BasicVector<Vector3,_ExactFloat,_3UL> *)local_148,(D *)&dab.bn_);
    Vector3<ExactFloat>::~Vector3((Vector3<ExactFloat> *)&abc2.bn_);
    util::math::internal_vector::BasicVector<Vector3,_ExactFloat,_3UL>::Norm2
              ((BasicVector<Vector3,_ExactFloat,_3UL> *)&local_198);
    ::operator*((ExactFloat *)&bca2.bn_,(ExactFloat *)local_108);
    ::operator*((ExactFloat *)local_188,&local_198);
    ExactFloat::~ExactFloat((ExactFloat *)&bca2.bn_);
    ExactFloat::~ExactFloat(&local_198);
    util::math::internal_vector::BasicVector<Vector3,_ExactFloat,_3UL>::Norm2
              ((BasicVector<Vector3,_ExactFloat,_3UL> *)&local_1c8);
    ::operator*((ExactFloat *)&cab2.bn_,(ExactFloat *)local_148);
    ::operator*((ExactFloat *)local_1b8,&local_1c8);
    ExactFloat::~ExactFloat((ExactFloat *)&cab2.bn_);
    ExactFloat::~ExactFloat(&local_1c8);
    util::math::internal_vector::BasicVector<Vector3,_ExactFloat,_3UL>::Norm2
              ((BasicVector<Vector3,_ExactFloat,_3UL> *)&local_1f8);
    ::operator*((ExactFloat *)&rhs3_sgn,(ExactFloat *)local_c8);
    ::operator*((ExactFloat *)local_1e8,&local_1f8);
    ExactFloat::~ExactFloat((ExactFloat *)&rhs3_sgn);
    ExactFloat::~ExactFloat(&local_1f8);
    lhs2_sgn = ExactFloat::sgn((ExactFloat *)local_c8);
    local_220[0] = ExactFloat::sgn((ExactFloat *)local_108);
    local_210 = -local_220[0];
    local_220[2] = 0xffffffff;
    local_220[1] = 1;
    local_220[0] = lhs2_sgn + local_220[0];
    piVar5 = std::min<int>(local_220 + 1,local_220);
    piVar5 = std::max<int>(local_220 + 2,piVar5);
    local_220[3] = *piVar5;
    if ((local_220[3] == 0) && (lhs2_sgn != 0)) {
      ::operator-((ExactFloat *)&result,(ExactFloat *)local_1e8);
      local_220[3] = ExactFloat::sgn((ExactFloat *)&result);
      local_220[3] = local_220[3] * lhs2_sgn;
      ExactFloat::~ExactFloat((ExactFloat *)&result);
    }
    iVar2 = ExactFloat::sgn((ExactFloat *)local_148);
    local_234 = -iVar2;
    local_23c = -1;
    lhs4_sgn = 1;
    rhs4.bn_.bn_._4_4_ = local_220[3] + iVar2;
    piVar5 = std::min<int>(&lhs4_sgn,(int *)((long)&rhs4.bn_.bn_ + 4));
    piVar5 = std::max<int>(&local_23c,piVar5);
    local_238 = *piVar5;
    if ((local_238 == 0) && (local_220[3] != 0)) {
      iVar2 = ExactFloat::sgn((ExactFloat *)local_c8);
      iVar3 = ExactFloat::sgn((ExactFloat *)local_108);
      rhs4.bn_.bn_._0_4_ = iVar2 * iVar3;
      ::operator-(&local_268,(ExactFloat *)local_1b8);
      ::operator-((ExactFloat *)local_258,&local_268);
      ExactFloat::~ExactFloat(&local_268);
      iVar2 = (int)rhs4.bn_.bn_;
      local_274[2] = 0xffffffff;
      local_274[1] = 1;
      local_274[0] = ExactFloat::sgn((ExactFloat *)local_258);
      local_274[0] = iVar2 - local_274[0];
      piVar5 = std::min<int>(local_274 + 1,local_274);
      piVar5 = std::max<int>(local_274 + 2,piVar5);
      local_238 = *piVar5;
      if ((local_238 == 0) && ((int)rhs4.bn_.bn_ != 0)) {
        ExactFloat::ExactFloat(&local_2b8,4);
        ::operator*(&local_2a8,&local_2b8);
        ::operator*(&local_298,&local_2a8);
        ::operator*(&local_2c8,(ExactFloat *)local_258);
        ::operator-(&local_288,&local_298);
        local_238 = ExactFloat::sgn(&local_288);
        local_238 = local_238 * (int)rhs4.bn_.bn_;
        ExactFloat::~ExactFloat(&local_288);
        ExactFloat::~ExactFloat(&local_2c8);
        ExactFloat::~ExactFloat(&local_298);
        ExactFloat::~ExactFloat(&local_2a8);
        ExactFloat::~ExactFloat(&local_2b8);
      }
      local_238 = local_220[3] * local_238;
      ExactFloat::~ExactFloat((ExactFloat *)local_258);
    }
    x0_local._4_4_ = local_3c * local_238;
    ExactFloat::~ExactFloat((ExactFloat *)local_1e8);
    ExactFloat::~ExactFloat((ExactFloat *)local_1b8);
    ExactFloat::~ExactFloat((ExactFloat *)local_188);
    ExactFloat::~ExactFloat((ExactFloat *)local_148);
    ExactFloat::~ExactFloat((ExactFloat *)local_108);
    ExactFloat::~ExactFloat((ExactFloat *)local_c8);
    Vector3<ExactFloat>::~Vector3((Vector3<ExactFloat> *)&dab.bn_);
  }
  return x0_local._4_4_;
}

Assistant:

int ExactEdgeCircumcenterSign(const Vector3_xf& x0, const Vector3_xf& x1,
                              const Vector3_xf& a, const Vector3_xf& b,
                              const Vector3_xf& c, int abc_sign) {
  // Return zero if the edge X is degenerate.  (Also see the comments in
  // SymbolicEdgeCircumcenterSign.)
  if (ArePointsLinearlyDependent(x0, x1)) {
    S2_DCHECK_GT(x0.DotProd(x1), 0);  // Antipodal edges not allowed.
    return 0;
  }
  // The simplest predicate for testing whether the sign is positive is
  //
  // (1)  (X0 x X1) . (|C|(A x B) + |A|(B x C) + |B|(C x A)) > 0
  //
  // where |A| denotes A.Norm() and the expression after the "." represents
  // the circumcenter of triangle ABC.  (This predicate is terrible from a
  // numerical accuracy point of view, but that doesn't matter since we are
  // going to use exact arithmetic.)  This predicate also assumes that
  // triangle ABC is CCW (positive sign); we correct for that below.
  //
  // The only problem with evaluating this inequality is that computing |A|,
  // |B| and |C| requires square roots.  To avoid this problem we use the
  // standard technique of rearranging the inequality to isolate at least one
  // square root and then squaring both sides.  We need to repeat this process
  // twice in order to eliminate all the square roots, which leads to a
  // polynomial predicate of degree 20 in the input arguments.
  //
  // Rearranging (1) we get
  //
  //      (X0 x X1) . (|C|(A x B) + |A|(B x C)) > |B|(X0 x X1) . (A x C)
  //
  // Before squaring we need to check the sign of each side.  If the signs are
  // different then we know the result without squaring, and if the signs are
  // both negative then after squaring both sides we need to invert the
  // result.  Define
  //
  //      dAB = (X0 x X1) . (A x B)
  //      dBC = (X0 x X1) . (B x C)
  //      dCA = (X0 x X1) . (C x A)
  //
  // Then we can now write the inequality above as
  //
  // (2)  |C| dAB + |A| dBC > -|B| dCA
  //
  // The RHS of (2) is positive if dCA < 0, and the LHS of (2) is positive if
  // (|C| dAB + |A| dBC) > 0.  Since the LHS has square roots, we need to
  // eliminate them using the same process.  Rewriting the LHS as
  //
  // (3)  |C| dAB > -|A| dBC
  //
  // we again need to check the signs of both sides.  Let's start with that.
  // We also precompute the following values because they are used repeatedly
  // when squaring various expressions below:
  //
  //     abc2 = |A|^2 dBC^2
  //     bca2 = |B|^2 dCA^2
  //     cab2 = |C|^2 dAB^2
  Vector3_xf nx = x0.CrossProd(x1);
  ExactFloat dab = nx.DotProd(a.CrossProd(b));
  ExactFloat dbc = nx.DotProd(b.CrossProd(c));
  ExactFloat dca = nx.DotProd(c.CrossProd(a));
  ExactFloat abc2 = a.Norm2() * (dbc * dbc);
  ExactFloat bca2 = b.Norm2() * (dca * dca);
  ExactFloat cab2 = c.Norm2() * (dab * dab);

  // If the two sides of (3) have different signs (including the case where
  // one side is zero) then we know the result.  Also, if both sides are zero
  // then we know the result.  The following logic encodes this.
  int lhs3_sgn = dab.sgn(), rhs3_sgn = -dbc.sgn();
  int lhs2_sgn = max(-1, min(1, lhs3_sgn - rhs3_sgn));
  if (lhs2_sgn == 0 && lhs3_sgn != 0) {
    // Both sides of (3) have the same non-zero sign, so square both sides.
    // If both sides were negative then invert the result.
    lhs2_sgn = (cab2 - abc2).sgn() * lhs3_sgn;
  }
  // Now if the two sides of (2) have different signs then we know the result
  // of this entire function.
  int rhs2_sgn = -dca.sgn();
  int result = max(-1, min(1, lhs2_sgn - rhs2_sgn));
  if (result == 0 && lhs2_sgn != 0) {
    // Both sides of (2) have the same non-zero sign, so square both sides.
    // (If both sides were negative then we invert the result below.)
    // This gives
    //
    //        |C|^2 dAB^2 + |A|^2 dBC^2 + 2 |A| |C| dAB dBC > |B|^2 dCA^2
    //
    // This expression still has square roots (|A| and |C|), so we rewrite as
    //
    // (4)    2 |A| |C| dAB dBC > |B|^2 dCA^2 - |C|^2 dAB^2 - |A|^2 dBC^2 .
    //
    // Again, if the two sides have different signs then we know the result.
    int lhs4_sgn = dab.sgn() * dbc.sgn();
    ExactFloat rhs4 = bca2 - cab2 - abc2;
    result = max(-1, min(1, lhs4_sgn - rhs4.sgn()));
    if (result == 0 && lhs4_sgn != 0) {
      // Both sides of (4) have the same non-zero sign, so square both sides.
      // If both sides were negative then invert the result.
      result = (4 * abc2 * cab2 - rhs4 * rhs4).sgn() * lhs4_sgn;
    }
    // Correct the sign if both sides of (2) were negative.
    result *= lhs2_sgn;
  }
  // If the sign of triangle ABC is negative, then we have computed -Z and the
  // result should be negated.
  return abc_sign * result;
}